

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

ssize_t __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
          (File<hta::storage::file::Metric::Header,_hta::TimeValue> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  _Ios_Iostate _Var1;
  _Ios_Iostate _Var2;
  TimeValue *pTVar3;
  ulong uVar4;
  size_type sVar5;
  ssize_t sVar6;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *this_00;
  streamsize count;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *vec_local;
  File<hta::storage::file::Metric::Header,_hta::TimeValue> *this_local;
  
  this_00 = (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)
            CONCAT44(in_register_00000034,__fd);
  pTVar3 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::data(this_00);
  std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::size(this_00);
  std::istream::read((char *)&this->stream_,(long)pTVar3);
  _Var1 = std::ios::rdstate();
  _Var2 = std::operator|(_S_failbit,_S_eofbit);
  if (_Var1 == _Var2) {
    uVar4 = std::istream::gcount();
    if ((uVar4 & 0xf) != 0) {
      __assert_fail("0 == count % value_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                    ,0xf3,
                    "void hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeValue>::read(std::vector<value_type> &) [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeValue]"
                   );
    }
    sVar5 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::size(this_00);
    if (sVar5 < uVar4 >> 4) {
      __assert_fail("count / value_size <= vec.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                    ,0xf4,
                    "void hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeValue>::read(std::vector<value_type> &) [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeValue]"
                   );
    }
    std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::resize(this_00,uVar4 >> 4);
    sVar6 = std::ios::clear((int)this + 0x28 + (int)*(undefined8 *)(*(long *)&this->stream_ + -0x18)
                           );
  }
  else {
    check_stream(this,"read vector");
    sVar6 = extraout_RAX;
  }
  return sVar6;
}

Assistant:

void read(std::vector<value_type>& vec)
    {
        static_assert(std::is_trivially_copyable_v<T>, "T must be a POD.");
        stream_.read(reinterpret_cast<char*>(vec.data()), value_size * vec.size());
        if (stream_.rdstate() == (std::ios_base::failbit | std::ios_base::eofbit))
        {
            // how much did we actually read...
            auto count = stream_.gcount();
            assert(0 == count % value_size);
            assert(count / value_size <= vec.size());
            vec.resize(count / value_size);
            stream_.clear();
        }
        else
        {
            check_stream("read vector");
        }
    }